

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_vprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  jx9_int64 jVar2;
  int nArg_00;
  char *zIn;
  int nLen;
  jx9_int64 nCounter;
  SySet sArg;
  
  nCounter = 0;
  if ((((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 0x40) == 0)) ||
     (zIn = jx9_value_to_string(*apArg,&nLen), nLen < 1)) {
    pjVar1 = pCtx->pRet;
    jx9MemObjRelease(pjVar1);
    (pjVar1->x).rVal = 0.0;
    pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 2;
  }
  else {
    nArg_00 = jx9HashmapValuesToSet((jx9_hashmap *)(apArg[1]->x).pOther,&sArg);
    jx9InputFormat(printfConsumer,pCtx,zIn,nLen,nArg_00,(jx9_value **)sArg.pBase,&nCounter,1);
    jVar2 = nCounter;
    pjVar1 = pCtx->pRet;
    jx9MemObjRelease(pjVar1);
    (pjVar1->x).iVal = jVar2;
    pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 2;
    if (sArg.pBase != (void *)0x0 && sArg.pAllocator != (SyMemBackend *)0x0) {
      SyMemBackendFree(sArg.pAllocator,sArg.pBase);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_vprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_int64 nCounter = 0;
	const char *zFormat;
	jx9_hashmap *pMap;
	SySet sArg;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	/* Extract arguments from the hashmap */
	n = jx9HashmapValuesToSet(pMap, &sArg);
	/* Format the string */
	jx9InputFormat(printfConsumer, pCtx, zFormat, nLen, n, (jx9_value **)SySetBasePtr(&sArg), (void *)&nCounter, TRUE);
	/* Return the length of the outputted string */
	jx9_result_int64(pCtx, nCounter);
	/* Release the container */
	SySetRelease(&sArg);
	return JX9_OK;
}